

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

int convert_code_r(compiler_state_t *cstate,conv_state_t *conv_state,icode *ic,block *p)

{
  int iVar1;
  u_int uVar2;
  uint uVar3;
  char *ljerr;
  int local_60;
  int jf;
  int jt;
  u_int i;
  slist **offset;
  uint local_48;
  int extrajmps;
  u_int off;
  u_int slen;
  slist *src;
  bpf_insn *dst;
  block *p_local;
  icode *ic_local;
  conv_state_t *conv_state_local;
  compiler_state_t *cstate_local;
  
  _jt = (void *)0x0;
  if ((p == (block *)0x0) || (p->mark == ic->cur_mark)) {
    cstate_local._4_4_ = 1;
  }
  else {
    p->mark = ic->cur_mark;
    iVar1 = convert_code_r(cstate,conv_state,ic,(p->ef).succ);
    if (iVar1 == 0) {
      cstate_local._4_4_ = 0;
    }
    else {
      iVar1 = convert_code_r(cstate,conv_state,ic,(p->et).succ);
      if (iVar1 == 0) {
        cstate_local._4_4_ = 0;
      }
      else {
        uVar2 = slength(p->stmts);
        src = (slist *)(conv_state->ftail + -(ulong)(uVar2 + 1 + p->longjt + p->longjf));
        conv_state->ftail = (bpf_insn *)src;
        p->offset = (int)((long)src - (long)conv_state->fstart >> 3);
        if ((uVar2 != 0) && (_jt = calloc((ulong)uVar2,8), _jt == (void *)0x0)) {
          bpf_error(cstate,"not enough core");
        }
        _off = p->stmts;
        for (local_48 = 0; local_48 < uVar2 && _off != (slist *)0x0; local_48 = local_48 + 1) {
          *(slist **)((long)_jt + (ulong)local_48 * 8) = _off;
          _off = _off->next;
        }
        local_48 = 0;
        for (_off = p->stmts; _off != (slist *)0x0; _off = _off->next) {
          if ((_off->s).code != -1) {
            *(short *)&(src->s).code = (short)(_off->s).code;
            *(bpf_int32 *)&(src->s).field_0x4 = (_off->s).k;
            if (((((_off->s).code & 7U) == 5) && ((_off->s).code != 5)) && (local_48 != uVar2 - 2))
            {
              if (((_off->s).jt == (slist *)0x0) || ((_off->s).jf == (slist *)0x0)) {
                bpf_error(cstate,"%s for block-local relative jump: off=%d","no jmp destination",
                          (ulong)local_48);
              }
              ljerr._4_4_ = 0;
              local_60 = 0;
              for (jf = 0; (uint)jf < uVar2; jf = jf + 1) {
                if (*(slist **)((long)_jt + (ulong)(uint)jf * 8) == (_off->s).jt) {
                  if (local_60 != 0) {
                    bpf_error(cstate,"%s for block-local relative jump: off=%d","multiple matches",
                              (ulong)local_48);
                  }
                  *(char *)((long)&(src->s).code + 2) = ((char)jf - (char)local_48) + -1;
                  local_60 = local_60 + 1;
                }
                if (*(slist **)((long)_jt + (ulong)(uint)jf * 8) == (_off->s).jf) {
                  if (ljerr._4_4_ != 0) {
                    bpf_error(cstate,"%s for block-local relative jump: off=%d","multiple matches",
                              (ulong)local_48);
                  }
                  *(char *)((long)&(src->s).code + 3) = ((char)jf - (char)local_48) + -1;
                  ljerr._4_4_ = ljerr._4_4_ + 1;
                }
              }
              if ((local_60 == 0) || (ljerr._4_4_ == 0)) {
                bpf_error(cstate,"%s for block-local relative jump: off=%d","no destination found",
                          (ulong)local_48);
              }
            }
            src = (slist *)&(src->s).jt;
            local_48 = local_48 + 1;
          }
        }
        if (_jt != (void *)0x0) {
          free(_jt);
        }
        *(short *)&(src->s).code = (short)(p->s).code;
        *(bpf_int32 *)&(src->s).field_0x4 = (p->s).k;
        if ((p->et).succ != (block *)0x0) {
          offset._4_4_ = 0;
          iVar1 = ((p->et).succ)->offset - (p->offset + uVar2);
          uVar3 = iVar1 - 1;
          if (uVar3 < 0x100) {
            *(char *)((long)&(src->s).code + 2) = (char)uVar3;
          }
          else {
            if (p->longjt == 0) {
              p->longjt = p->longjt + 1;
              return 0;
            }
            *(undefined1 *)((long)&(src->s).code + 2) = 0;
            offset._4_4_ = 1;
            *(undefined2 *)&(src->s).jt = 5;
            *(int *)((long)&(src->s).jt + 4) = iVar1 + -2;
          }
          uVar3 = (((p->ef).succ)->offset - (p->offset + uVar2)) - 1;
          if (uVar3 < 0x100) {
            *(char *)((long)&(src->s).code + 3) = (char)uVar3;
          }
          else {
            if (p->longjf == 0) {
              p->longjf = p->longjf + 1;
              return 0;
            }
            *(char *)((long)&(src->s).code + 3) = (char)offset._4_4_;
            iVar1 = offset._4_4_ + 1;
            *(undefined2 *)(&(src->s).code + (long)iVar1 * 2) = 5;
            *(uint *)(&(src->s).field_0x4 + (long)iVar1 * 8) = uVar3 - iVar1;
          }
        }
        cstate_local._4_4_ = 1;
      }
    }
  }
  return cstate_local._4_4_;
}

Assistant:

static int
convert_code_r(compiler_state_t *cstate, conv_state_t *conv_state,
    struct icode *ic, struct block *p)
{
	struct bpf_insn *dst;
	struct slist *src;
	u_int slen;
	u_int off;
	int extrajmps;		/* number of extra jumps inserted */
	struct slist **offset = NULL;

	if (p == 0 || isMarked(ic, p))
		return (1);
	Mark(ic, p);

	if (convert_code_r(cstate, conv_state, ic, JF(p)) == 0)
		return (0);
	if (convert_code_r(cstate, conv_state, ic, JT(p)) == 0)
		return (0);

	slen = slength(p->stmts);
	dst = conv_state->ftail -= (slen + 1 + p->longjt + p->longjf);
		/* inflate length by any extra jumps */

	p->offset = (int)(dst - conv_state->fstart);

	/* generate offset[] for convenience  */
	if (slen) {
		offset = (struct slist **)calloc(slen, sizeof(struct slist *));
		if (!offset) {
			bpf_error(cstate, "not enough core");
			/*NOTREACHED*/
		}
	}
	src = p->stmts;
	for (off = 0; off < slen && src; off++) {
#if 0
		printf("off=%d src=%x\n", off, src);
#endif
		offset[off] = src;
		src = src->next;
	}

	off = 0;
	for (src = p->stmts; src; src = src->next) {
		if (src->s.code == NOP)
			continue;
		dst->code = (u_short)src->s.code;
		dst->k = src->s.k;

		/* fill block-local relative jump */
		if (BPF_CLASS(src->s.code) != BPF_JMP || src->s.code == (BPF_JMP|BPF_JA)) {
#if 0
			if (src->s.jt || src->s.jf) {
				bpf_error(cstate, "illegal jmp destination");
				/*NOTREACHED*/
			}
#endif
			goto filled;
		}
		if (off == slen - 2)	/*???*/
			goto filled;

	    {
		u_int i;
		int jt, jf;
		const char *ljerr = "%s for block-local relative jump: off=%d";

#if 0
		printf("code=%x off=%d %x %x\n", src->s.code,
			off, src->s.jt, src->s.jf);
#endif

		if (!src->s.jt || !src->s.jf) {
			bpf_error(cstate, ljerr, "no jmp destination", off);
			/*NOTREACHED*/
		}

		jt = jf = 0;
		for (i = 0; i < slen; i++) {
			if (offset[i] == src->s.jt) {
				if (jt) {
					bpf_error(cstate, ljerr, "multiple matches", off);
					/*NOTREACHED*/
				}

				dst->jt = i - off - 1;
				jt++;
			}
			if (offset[i] == src->s.jf) {
				if (jf) {
					bpf_error(cstate, ljerr, "multiple matches", off);
					/*NOTREACHED*/
				}
				dst->jf = i - off - 1;
				jf++;
			}
		}
		if (!jt || !jf) {
			bpf_error(cstate, ljerr, "no destination found", off);
			/*NOTREACHED*/
		}
	    }
filled:
		++dst;
		++off;
	}
	if (offset)
		free(offset);

#ifdef BDEBUG
	bids[dst - conv_state->fstart] = p->id + 1;
#endif
	dst->code = (u_short)p->s.code;
	dst->k = p->s.k;
	if (JT(p)) {
		extrajmps = 0;
		off = JT(p)->offset - (p->offset + slen) - 1;
		if (off >= 256) {
		    /* offset too large for branch, must add a jump */
		    if (p->longjt == 0) {
		    	/* mark this instruction and retry */
			p->longjt++;
			return(0);
		    }
		    /* branch if T to following jump */
		    dst->jt = extrajmps;
		    extrajmps++;
		    dst[extrajmps].code = BPF_JMP|BPF_JA;
		    dst[extrajmps].k = off - extrajmps;
		}
		else
		    dst->jt = off;
		off = JF(p)->offset - (p->offset + slen) - 1;
		if (off >= 256) {
		    /* offset too large for branch, must add a jump */
		    if (p->longjf == 0) {
		    	/* mark this instruction and retry */
			p->longjf++;
			return(0);
		    }
		    /* branch if F to following jump */
		    /* if two jumps are inserted, F goes to second one */
		    dst->jf = extrajmps;
		    extrajmps++;
		    dst[extrajmps].code = BPF_JMP|BPF_JA;
		    dst[extrajmps].k = off - extrajmps;
		}
		else
		    dst->jf = off;
	}
	return (1);
}